

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

uint8_t * bcf_unpack_info_core1(uint8_t *ptr,bcf_info_t *info)

{
  int32_t iVar1;
  uint8_t *puVar2;
  uint8_t *ptr_start;
  bcf_info_t *info_local;
  uint8_t *ptr_local;
  
  info_local = (bcf_info_t *)ptr;
  iVar1 = bcf_dec_typed_int1(ptr,(uint8_t **)&info_local);
  info->key = iVar1;
  iVar1 = bcf_dec_size((uint8_t *)info_local,(uint8_t **)&info_local,&info->type);
  info->len = iVar1;
  info->vptr = (uint8_t *)info_local;
  *(uint *)&info->field_0x1c =
       *(uint *)&info->field_0x1c & 0x80000000 | (int)info_local - (int)ptr & 0x7fffffffU;
  *(uint *)&info->field_0x1c = *(uint *)&info->field_0x1c & 0x7fffffff;
  (info->v1).i = 0;
  if (info->len == 1) {
    if ((info->type == 1) || (info->type == 7)) {
      info->v1 = (anon_union_4_2_947300a4_for_v1)(int)(char)info_local->key;
    }
    else if (info->type == 3) {
      info->v1 = (anon_union_4_2_947300a4_for_v1)info_local->key;
    }
    else if (info->type == 5) {
      info->v1 = (anon_union_4_2_947300a4_for_v1)info_local->key;
    }
    else if (info->type == 2) {
      info->v1 = (anon_union_4_2_947300a4_for_v1)(int)(short)info_local->key;
    }
  }
  puVar2 = (uint8_t *)
           ((long)&info_local->key + (long)(info->len << (bcf_type_shift[info->type] & 0x1f)));
  info->vptr_len = (int)puVar2 - (int)info->vptr;
  return puVar2;
}

Assistant:

static inline uint8_t *bcf_unpack_info_core1(uint8_t *ptr, bcf_info_t *info)
{
    uint8_t *ptr_start = ptr;
    info->key = bcf_dec_typed_int1(ptr, &ptr);
    info->len = bcf_dec_size(ptr, &ptr, &info->type);
    info->vptr = ptr;
    info->vptr_off  = ptr - ptr_start;
    info->vptr_free = 0;
    info->v1.i = 0;
    if (info->len == 1) {
        if (info->type == BCF_BT_INT8 || info->type == BCF_BT_CHAR) info->v1.i = *(int8_t*)ptr;
        else if (info->type == BCF_BT_INT32) info->v1.i = *(int32_t*)ptr;
        else if (info->type == BCF_BT_FLOAT) info->v1.f = *(float*)ptr;
        else if (info->type == BCF_BT_INT16) info->v1.i = *(int16_t*)ptr;
    }
    ptr += info->len << bcf_type_shift[info->type];
    info->vptr_len = ptr - info->vptr;
    return ptr;
}